

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O2

int count_tests(TestSuite *suite)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)suite->size;
  if (suite->size < 1) {
    uVar2 = uVar4;
  }
  iVar3 = 0;
  for (; uVar2 * 0x18 - uVar4 != 0; uVar4 = uVar4 + 0x18) {
    if (*(int *)((long)&suite->tests->type + uVar4) == 0) {
      iVar3 = iVar3 + 1;
    }
    else {
      iVar1 = count_tests(*(TestSuite **)((long)&suite->tests->Runnable + uVar4));
      iVar3 = iVar3 + iVar1;
    }
  }
  return iVar3;
}

Assistant:

int count_tests(TestSuite *suite) {
    int count = 0;
    int i;
    for (i = 0; i < suite->size; i++) {
        if (suite->tests[i].type == test_function) {
            count++;
        } else {
            count += count_tests(suite->tests[i].Runnable.suite);
        }
    }
    return count;
}